

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::record::
Base<njoy::ENDFtk::record::Integer<33>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Base<njoy::ENDFtk::record::Integer<33>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
           *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end)

{
  long lVar1;
  FieldTuple *result;
  
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = tools::disco::Integer<33u>::
          read<long,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(it,end);
  *(long *)(this + 0x18) = lVar1;
  tools::disco::
  Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::RetainCarriage>
  ::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long,long,long>
            (it,end,(long *)(this + 0x10),(long *)(this + 8),(long *)this);
  return;
}

Assistant:

Base( Iterator& it, const Iterator& end )
      try :
        fields( readFields< nFields - 1 >( it, end, std::true_type() ) )
    {
    } catch( std::exception& e ){
      Log::info( "Encountered error when reading Base of Record" );
      Log::info( "what(): {}", e.what() );
      throw e;
    }